

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O0

void __thiscall
ActionQueue::AddAction(ActionQueue *this,PacketReader *reader,double time,bool auto_queue)

{
  ActionQueue_Action *this_00;
  PacketReader local_58;
  ActionQueue_Action *local_30;
  byte local_21;
  double dStack_20;
  bool auto_queue_local;
  double time_local;
  PacketReader *reader_local;
  ActionQueue *this_local;
  
  local_21 = auto_queue;
  dStack_20 = time;
  time_local = (double)reader;
  reader_local = (PacketReader *)this;
  this_00 = (ActionQueue_Action *)operator_new(0x38);
  PacketReader::PacketReader(&local_58,(PacketReader *)time_local);
  ActionQueue_Action::ActionQueue_Action(this_00,&local_58,dStack_20,(bool)(local_21 & 1));
  local_30 = this_00;
  std::
  queue<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>,std::deque<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>,std::allocator<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>>>>
  ::emplace<ActionQueue_Action*>
            ((queue<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>,std::deque<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>,std::allocator<std::unique_ptr<ActionQueue_Action,std::default_delete<ActionQueue_Action>>>>>
              *)this,&local_30);
  PacketReader::~PacketReader(&local_58);
  return;
}

Assistant:

void ActionQueue::AddAction(const PacketReader& reader, double time, bool auto_queue)
{
	this->queue.emplace(new ActionQueue_Action(reader, time, auto_queue));
}